

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  BYTE *pBVar3;
  undefined8 uVar4;
  U32 lowestValid;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  int *ip;
  int *iend;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  seqDef *psVar14;
  uint local_88;
  size_t offbaseFound;
  uint local_64;
  uint local_60;
  uint local_5c;
  long local_58;
  int *local_50;
  int *local_48;
  BYTE *local_40;
  uint *local_38;
  
  pBVar3 = (ms->window).base;
  uVar11 = (ms->window).dictLimit;
  local_40 = pBVar3 + uVar11;
  uVar7 = (ms->cParams).minMatch;
  uVar9 = 6;
  if (uVar7 < 6) {
    uVar9 = uVar7;
  }
  uVar7 = 4;
  if (4 < uVar9) {
    uVar7 = uVar9;
  }
  local_5c = *rep;
  ip = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  iVar10 = (int)ip - (int)pBVar3;
  uVar9 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_60 = iVar10 - uVar9;
  if (iVar10 - uVar11 <= uVar9) {
    local_60 = uVar11;
  }
  if (ms->loadedDictEnd != 0) {
    local_60 = uVar11;
  }
  local_64 = rep[1];
  local_60 = iVar10 - local_60;
  local_88 = local_64;
  if (local_60 < local_64) {
    local_88 = 0;
  }
  uVar11 = local_5c;
  if (local_60 < local_5c) {
    uVar11 = 0;
  }
  uVar12 = (ulong)uVar11;
  ms->lazySkipping = 0;
  pInLimit = (int *)((long)src + srcSize);
  local_48 = (int *)((long)src + (srcSize - 8));
  local_50 = (int *)((long)src + (srcSize - 0x20));
  local_38 = rep;
  do {
    local_58 = -uVar12;
    while( true ) {
      uVar11 = (uint)uVar12;
      if (local_48 <= ip) {
        if (local_64 <= local_60) {
          local_64 = 0;
        }
        uVar7 = local_64;
        if (uVar11 != 0) {
          uVar7 = local_5c;
        }
        if (local_5c <= local_60) {
          uVar7 = local_64;
          local_5c = 0;
        }
        if (uVar11 != 0) {
          local_5c = uVar11;
        }
        if (local_88 != 0) {
          uVar7 = local_88;
        }
        *local_38 = local_5c;
        local_38[1] = uVar7;
        return (long)pInLimit - (long)src;
      }
      if ((uVar11 != 0) && (*(int *)((long)ip + local_58 + 1) == *(int *)((long)ip + 1))) {
        iend = (int *)((long)ip + 1);
        sVar6 = ZSTD_count((BYTE *)((long)ip + 5),(BYTE *)((long)ip + local_58 + 5),(BYTE *)pInLimit
                          );
        uVar5 = sVar6 + 4;
        sVar6 = 1;
        goto LAB_0017c2e1;
      }
      offbaseFound = 999999999;
      if (uVar7 == 6) {
        uVar5 = ZSTD_HcFindBestMatch_noDict_6(ms,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (uVar7 == 5) {
        uVar5 = ZSTD_HcFindBestMatch_noDict_5(ms,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar5 = ZSTD_HcFindBestMatch_noDict_4(ms,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      if (3 < uVar5) break;
      uVar5 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar5 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar5);
    }
    iend = ip;
    sVar6 = offbaseFound;
    if (3 < offbaseFound) {
      for (; ((src < ip && (local_40 < (BYTE *)((long)ip + (3 - offbaseFound)))) &&
             (*(char *)((long)ip + -1) == *(char *)((long)ip + (2 - offbaseFound))));
          ip = (int *)((long)ip + -1)) {
        uVar5 = uVar5 + 1;
      }
      uVar12 = (ulong)((int)offbaseFound - 3);
      iend = ip;
      local_88 = uVar11;
    }
LAB_0017c2e1:
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0017c65a:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_0017c63b:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar13 = (long)iend - (long)src;
    pBVar3 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar3 + uVar13) {
LAB_0017c5fd:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < iend) {
LAB_0017c61c:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_50 < iend) {
      ZSTD_safecopyLiterals(pBVar3,(BYTE *)src,(BYTE *)iend,(BYTE *)local_50);
LAB_0017c34e:
      seqStore->lit = seqStore->lit + uVar13;
      if (0xffff < uVar13) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar3 = *src;
      *(undefined8 *)(pBVar3 + 8) = uVar4;
      pBVar3 = seqStore->lit;
      if (0x10 < uVar13) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar3 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar4 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar3 + 0x18) = uVar4;
        if (0x20 < (long)uVar13) {
          lVar8 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar8 + 0x20);
            uVar4 = puVar2[1];
            pBVar1 = pBVar3 + lVar8 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar4;
            puVar2 = (undefined8 *)((long)src + lVar8 + 0x30);
            uVar4 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar4;
            lVar8 = lVar8 + 0x20;
          } while (pBVar1 + 0x20 < pBVar3 + uVar13);
        }
        goto LAB_0017c34e;
      }
      seqStore->lit = pBVar3 + uVar13;
    }
    psVar14 = seqStore->sequences;
    psVar14->litLength = (U16)uVar13;
    psVar14->offBase = (U32)sVar6;
    if (uVar5 < 3) {
LAB_0017c5de:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar5 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0017c679:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar14->mlBase = (U16)(uVar5 - 3);
    psVar14 = psVar14 + 1;
    seqStore->sequences = psVar14;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    for (ip = (int *)((long)iend + uVar5);
        ((src = ip, local_88 != 0 && (ip <= local_48)) &&
        (*ip == *(int *)((long)ip - (ulong)local_88))); ip = (int *)((long)ip + sVar6 + 4)) {
      uVar11 = (uint)uVar12;
      sVar6 = ZSTD_count((BYTE *)(ip + 1),(BYTE *)((long)ip + (4 - (ulong)local_88)),
                         (BYTE *)pInLimit);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar14 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0017c65a;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0017c63b;
      pBVar3 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar3) goto LAB_0017c5fd;
      if (pInLimit < ip) goto LAB_0017c61c;
      if (local_50 < ip) {
        ZSTD_safecopyLiterals(pBVar3,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_50);
      }
      else {
        uVar4 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar3 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar3 + 8) = uVar4;
      }
      psVar14 = seqStore->sequences;
      psVar14->litLength = 0;
      psVar14->offBase = 1;
      if (sVar6 + 4 < 3) goto LAB_0017c5de;
      if (0xffff < sVar6 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0017c679;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar14->mlBase = (U16)(sVar6 + 1);
      psVar14 = psVar14 + 1;
      seqStore->sequences = psVar14;
      uVar12 = (ulong)local_88;
      local_88 = uVar11;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_noDict);
}